

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O0

bool llvm::formatv_object_base::consumeFieldLayout
               (StringRef *Spec,AlignStyle *Where,size_t *Align,char *Pad)

{
  bool bVar1;
  char cVar2;
  type_conflict1 tVar3;
  size_t sVar4;
  AlignStyle *pAVar5;
  StringRef SVar6;
  char *pcStack_60;
  bool Failed;
  size_t local_58;
  OptionalStorage<llvm::AlignStyle,_true> local_50;
  Optional<llvm::AlignStyle> Loc_1;
  size_t local_40;
  OptionalStorage<llvm::AlignStyle,_true> local_38;
  Optional<llvm::AlignStyle> Loc;
  char *Pad_local;
  size_t *Align_local;
  AlignStyle *Where_local;
  StringRef *Spec_local;
  
  *Where = Right;
  *Align = 0;
  *Pad = ' ';
  Loc.Storage = (OptionalStorage<llvm::AlignStyle,_true>)Pad;
  bVar1 = StringRef::empty(Spec);
  if (bVar1) {
    Spec_local._7_1_ = true;
  }
  else {
    sVar4 = StringRef::size(Spec);
    if (1 < sVar4) {
      cVar2 = StringRef::operator[](Spec,1);
      local_38 = (OptionalStorage<llvm::AlignStyle,_true>)translateLocChar(cVar2);
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_38);
      if (bVar1) {
        cVar2 = StringRef::operator[](Spec,0);
        *(char *)Loc.Storage = cVar2;
        pAVar5 = Optional<llvm::AlignStyle>::operator*((Optional<llvm::AlignStyle> *)&local_38);
        *Where = *pAVar5;
        _Loc_1 = StringRef::drop_front(Spec,2);
        Spec->Data = (char *)Loc_1.Storage;
        Spec->Length = local_40;
      }
      else {
        cVar2 = StringRef::operator[](Spec,0);
        local_50 = (OptionalStorage<llvm::AlignStyle,_true>)translateLocChar(cVar2);
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_50);
        if (bVar1) {
          pAVar5 = Optional<llvm::AlignStyle>::operator*((Optional<llvm::AlignStyle> *)&local_50);
          *Where = *pAVar5;
          SVar6 = StringRef::drop_front(Spec,1);
          pcStack_60 = SVar6.Data;
          Spec->Data = pcStack_60;
          local_58 = SVar6.Length;
          Spec->Length = local_58;
        }
      }
    }
    tVar3 = StringRef::consumeInteger<unsigned_long>(Spec,0,Align);
    Spec_local._7_1_ = (bool)((tVar3 ^ 0xffU) & 1);
  }
  return Spec_local._7_1_;
}

Assistant:

bool formatv_object_base::consumeFieldLayout(StringRef &Spec, AlignStyle &Where,
                                             size_t &Align, char &Pad) {
  Where = AlignStyle::Right;
  Align = 0;
  Pad = ' ';
  if (Spec.empty())
    return true;

  if (Spec.size() > 1) {
    // A maximum of 2 characters at the beginning can be used for something
    // other
    // than the width.
    // If Spec[1] is a loc char, then Spec[0] is a pad char and Spec[2:...]
    // contains the width.
    // Otherwise, if Spec[0] is a loc char, then Spec[1:...] contains the width.
    // Otherwise, Spec[0:...] contains the width.
    if (auto Loc = translateLocChar(Spec[1])) {
      Pad = Spec[0];
      Where = *Loc;
      Spec = Spec.drop_front(2);
    } else if (auto Loc = translateLocChar(Spec[0])) {
      Where = *Loc;
      Spec = Spec.drop_front(1);
    }
  }

  bool Failed = Spec.consumeInteger(0, Align);
  return !Failed;
}